

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  DescriptorProto *pDVar4;
  EnumDescriptorProto *pEVar5;
  ServiceDescriptorProto *pSVar6;
  FieldDescriptorProto *pFVar7;
  FileOptions *pFVar8;
  int local_28;
  int local_24;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *this_local;
  
  for (i_2 = 0; iVar2 = message_type_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    pDVar4 = message_type(this,i_2);
    uVar3 = (*(pDVar4->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  for (i_3 = 0; iVar2 = enum_type_size(this), i_3 < iVar2; i_3 = i_3 + 1) {
    pEVar5 = enum_type(this,i_3);
    uVar3 = (*(pEVar5->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  for (local_24 = 0; iVar2 = service_size(this), local_24 < iVar2; local_24 = local_24 + 1) {
    pSVar6 = service(this,local_24);
    uVar3 = (*(pSVar6->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  for (local_28 = 0; iVar2 = extension_size(this), local_28 < iVar2; local_28 = local_28 + 1) {
    pFVar7 = extension(this,local_28);
    uVar3 = (*(pFVar7->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  bVar1 = has_options(this);
  if (bVar1) {
    pFVar8 = options(this);
    uVar3 = (*(pFVar8->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {

  for (int i = 0; i < message_type_size(); i++) {
    if (!this->message_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < enum_type_size(); i++) {
    if (!this->enum_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < service_size(); i++) {
    if (!this->service(i).IsInitialized()) return false;
  }
  for (int i = 0; i < extension_size(); i++) {
    if (!this->extension(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}